

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O3

int mdb_midl_append_range(MDB_IDL *idp,MDB_ID id,uint n)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  puVar6 = *idp;
  uVar2 = *puVar6;
  uVar8 = (ulong)n;
  uVar7 = uVar2 + uVar8;
  if (puVar6[-1] < uVar7) {
    iVar5 = mdb_midl_grow(idp,n | 0x1ffff);
    if (iVar5 != 0) {
      return 0xc;
    }
    puVar6 = *idp;
  }
  *puVar6 = uVar7;
  auVar4 = _DAT_00111310;
  auVar3 = _DAT_00111300;
  if (n != 0) {
    lVar1 = uVar8 - 1;
    auVar9._8_4_ = (int)lVar1;
    auVar9._0_8_ = lVar1;
    auVar9._12_4_ = (int)((ulong)lVar1 >> 0x20);
    puVar6 = puVar6 + uVar2 + uVar8;
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_00111310;
    do {
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar7;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      auVar10 = (auVar10 | auVar3) ^ auVar4;
      if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                  auVar9._4_4_ < auVar10._4_4_) & 1)) {
        *puVar6 = id + uVar7;
      }
      if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
          auVar10._12_4_ <= auVar9._12_4_) {
        puVar6[-1] = id + uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      puVar6 = puVar6 + -2;
    } while ((uVar8 + 1 & 0xfffffffffffffffe) != uVar7);
  }
  return 0;
}

Assistant:

int mdb_midl_append_range( MDB_IDL *idp, MDB_ID id, unsigned n )
{
	MDB_ID *ids = *idp, len = ids[0];
	/* Too big? */
	if (len + n > ids[-1]) {
		if (mdb_midl_grow(idp, n | MDB_IDL_UM_MAX))
			return ENOMEM;
		ids = *idp;
	}
	ids[0] = len + n;
	ids += len;
	while (n)
		ids[n--] = id++;
	return 0;
}